

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnitBitVector.h
# Opt level: O1

BVIndex BVUnitT<unsigned_long>::CountBit(UnitWord64 bits)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  
  uVar4 = (int)bits - ((uint)(bits >> 1) & 0x55555555);
  uVar4 = (uVar4 & 0x33333333) + (uVar4 >> 2 & 0x33333333);
  uVar5 = (uVar4 & 0x7070707) + (uVar4 >> 4 & 0x7070707);
  uVar5 = (uVar5 >> 8) + uVar5;
  uVar4 = (uint)(bits >> 0x20);
  uVar4 = uVar4 - (uVar4 >> 1 & 0x55555555);
  uVar4 = (uVar4 & 0x33333333) + (uVar4 >> 2 & 0x33333333);
  uVar8 = (uVar4 & 0x7070707) + (uVar4 >> 4 & 0x7070707);
  uVar8 = (uVar8 >> 8) + uVar8;
  uVar7 = bits - (bits >> 1 & 0x5555555555555555);
  uVar7 = (uVar7 & 0x3333333333333333) + (uVar7 >> 2 & 0x3333333333333333);
  uVar7 = (uVar7 & 0x707070707070707) + (uVar7 >> 4 & 0x707070707070707);
  uVar7 = (uVar7 >> 8) + uVar7;
  lVar6 = (uVar7 >> 0x10) + uVar7;
  uVar4 = (int)((ulong)lVar6 >> 0x20) + (int)lVar6 & 0xff;
  if (uVar4 != ((uVar8 >> 0x10) + uVar8 & 0xff) + ((uVar5 >> 0x10) + uVar5 & 0xff)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/UnitBitVector.h"
                       ,0xa8,"(countBits == (bits & 0xff))","Wrong count?");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return uVar4;
}

Assistant:

static BVIndex CountBit(UnitWord64 bits)
    {
#if DBG
        unsigned countBits = CountBit((UnitWord32)bits) + CountBit((UnitWord32)(bits >> 32));
#endif

        const uint64 _5_64 =     0x5555555555555555ui64;
        const uint64 _3_64 =     0x3333333333333333ui64;
        const uint64 _F1_64 =    0x0f0f0f0f0f0f0f0fui64;

        // In-place adder tree: perform 32 1-bit adds, 16 2-bit adds, 8 4-bit adds,
        // 4 8-bit adds, 2 16-bit adds, and 1 32-bit add.
        // From Dr. Dobb's Nov. 2000 letters, from Phil Bagwell, on reducing
        // the cost by removing some of the masks that can be "forgotten" due
        // to the max # of bits set (64) that will fit in a byte.
        //

        bits -= (bits >> 1) & _5_64;
        bits = ((bits >> 2) & _3_64)  + (bits & _3_64);
        bits = ((bits >> 4) & _F1_64) + (bits & _F1_64);
        bits += bits >> 8;
        bits += bits >> 16;
        bits += bits >> 32;

        AssertMsg(countBits == (bits & 0xff), "Wrong count?");

        return (BVIndex)(bits & 0xff);
    }